

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O1

bool gl4cts::CopyImage::Utils::unpackAndComaprePixels
               (GLenum left_format,GLenum left_type,GLenum left_internal_format,GLubyte *left_pixel,
               GLenum right_format,GLenum right_type,GLenum right_internal_format,
               GLubyte *right_pixel)

{
  byte bVar1;
  bool bVar2;
  double dVar3;
  double dVar4;
  GLdouble left_blue;
  GLdouble left_green;
  GLdouble left_red;
  GLdouble right_blue;
  GLdouble right_green;
  GLdouble right_red;
  GLdouble right_alpha;
  GLdouble left_alpha;
  
  unpackPixel(left_format,left_type,left_pixel,&left_red,&left_green,&left_blue,&left_alpha);
  unpackPixel(right_format,right_type,right_pixel,&right_red,&right_green,&right_blue,&right_alpha);
  if (left_internal_format - 0x804f < 2) {
    bVar2 = left_internal_format == 0x804f;
    bVar1 = 4;
    if (!bVar2) {
      bVar1 = (left_internal_format == 0x8050) * '\x05';
    }
    dVar3 = (double)bVar1;
    dVar4 = exp2(dVar3);
    dVar4 = floor((dVar4 + -1.0) * left_red + 0.5);
    left_red = (GLdouble)((int)dVar4 << bVar2);
    dVar4 = exp2(dVar3);
    dVar4 = floor((dVar4 + -1.0) * left_green + 0.5);
    left_green = (GLdouble)((int)dVar4 << bVar2 + 1);
    dVar3 = exp2(dVar3);
    dVar3 = floor((dVar3 + -1.0) * left_blue + 0.5);
    left_blue = (GLdouble)((int)dVar3 << bVar2);
  }
  if (right_internal_format - 0x804f < 2) {
    bVar2 = right_internal_format == 0x804f;
    bVar1 = 4;
    if (!bVar2) {
      bVar1 = (right_internal_format == 0x8050) * '\x05';
    }
    dVar3 = (double)bVar1;
    dVar4 = exp2(dVar3);
    dVar4 = floor((dVar4 + -1.0) * right_red + 0.5);
    right_red = (GLdouble)((int)dVar4 << bVar2);
    dVar4 = exp2(dVar3);
    dVar4 = floor((dVar4 + -1.0) * right_green + 0.5);
    right_green = (GLdouble)((int)dVar4 << bVar2 + 1);
    dVar3 = exp2(dVar3);
    dVar3 = floor((dVar3 + -1.0) * right_blue + 0.5);
    right_blue = (GLdouble)((int)dVar3 << bVar2);
  }
  bVar2 = comparePixels(left_internal_format,&left_red,&left_green,&left_blue,&left_alpha,
                        right_internal_format,&right_red,&right_green,&right_blue,&right_alpha);
  return bVar2;
}

Assistant:

bool Utils::unpackAndComaprePixels(GLenum left_format, GLenum left_type, GLenum left_internal_format,
								   const GLubyte* left_pixel, GLenum right_format, GLenum right_type,
								   GLenum right_internal_format, const GLubyte* right_pixel)
{
	GLdouble left_red;
	GLdouble left_green;
	GLdouble left_blue;
	GLdouble left_alpha;
	GLdouble right_red;
	GLdouble right_green;
	GLdouble right_blue;
	GLdouble right_alpha;

	unpackPixel(left_format, left_type, left_pixel, left_red, left_green, left_blue, left_alpha);

	unpackPixel(right_format, right_type, right_pixel, right_red, right_green, right_blue, right_alpha);

	roundComponent(left_internal_format, GL_RED, left_red);
	roundComponent(left_internal_format, GL_GREEN, left_green);
	roundComponent(left_internal_format, GL_BLUE, left_blue);

	roundComponent(right_internal_format, GL_RED, right_red);
	roundComponent(right_internal_format, GL_GREEN, right_green);
	roundComponent(right_internal_format, GL_BLUE, right_blue);

	return comparePixels(left_internal_format, left_red, left_green, left_blue, left_alpha, right_internal_format,
						 right_red, right_green, right_blue, right_alpha);
}